

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_init_plane_quantizers(AV1_COMP *cpi,MACROBLOCK *x,int segment_id,int do_update)

{
  CommonQuantParams *quant_params;
  segmentation *seg;
  FRAME_TYPE frame_type;
  aom_enc_pass aVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  qm_val_t *(*__dest) [19];
  qm_val_t *(*paapqVar11) [3] [19];
  int local_3c [3];
  
  iVar3 = (cpi->ppi->p_rc).gfu_boost;
  iVar4 = 0xf;
  if (iVar3 < 0x640) {
    iVar4 = iVar3 / 100;
  }
  iVar3 = (cpi->ppi->gf_group).layer_depth[cpi->gf_frame_index];
  iVar10 = 6;
  if (iVar3 < 6) {
    iVar10 = iVar3;
  }
  iVar3 = (cpi->common).delta_q_info.delta_q_present_flag;
  iVar8 = (cpi->common).quant_params.base_qindex;
  if (iVar3 != 0) {
    iVar8 = iVar8 + x->delta_qindex;
  }
  quant_params = &(cpi->common).quant_params;
  iVar6 = 0xff;
  if ((iVar8 < 0x100) && (iVar6 = quant_params->base_qindex, iVar3 != 0)) {
    iVar6 = iVar6 + x->delta_qindex;
  }
  if (iVar6 < 0) {
    iVar8 = 0;
  }
  else {
    iVar6 = quant_params->base_qindex;
    if (iVar3 != 0) {
      iVar6 = iVar6 + x->delta_qindex;
    }
    iVar8 = 0xff;
    if ((iVar6 < 0x100) && (iVar8 = quant_params->base_qindex, iVar3 != 0)) {
      iVar8 = iVar8 + x->delta_qindex;
    }
  }
  frame_type = (cpi->common).current_frame.frame_type;
  seg = &(cpi->common).seg;
  iVar8 = av1_get_qindex(seg,segment_id,iVar8);
  iVar3 = iVar8;
  if ((cpi->oxcf).sb_qp_sweep != 0) {
    iVar3 = (cpi->common).delta_q_info.delta_q_present_flag;
    iVar6 = (cpi->common).quant_params.base_qindex;
    if (iVar3 != 0) {
      iVar6 = iVar6 + x->rdmult_delta_qindex;
    }
    iVar7 = 0xff;
    if ((iVar6 < 0x100) && (iVar7 = quant_params->base_qindex, iVar3 != 0)) {
      iVar7 = iVar7 + x->rdmult_delta_qindex;
    }
    if (iVar7 < 0) {
      iVar6 = 0;
    }
    else {
      iVar7 = quant_params->base_qindex;
      if (iVar3 != 0) {
        iVar7 = iVar7 + x->rdmult_delta_qindex;
      }
      iVar6 = 0xff;
      if ((iVar7 < 0x100) && (iVar6 = quant_params->base_qindex, iVar3 != 0)) {
        iVar6 = iVar6 + x->rdmult_delta_qindex;
      }
    }
    iVar3 = av1_get_qindex(seg,segment_id,iVar6);
  }
  aVar1 = (cpi->oxcf).pass;
  uVar5 = 1;
  if (((aVar1 < AOM_RC_LAST_PASS) && (uVar5 = 0, aVar1 == AOM_RC_ONE_PASS)) &&
     (cpi->compressor_stage == '\0')) {
    uVar5 = (uint)(cpi->ppi->lap_enabled != 0);
  }
  iVar4 = av1_compute_rd_mult((cpi->common).quant_params.y_dc_delta_q + iVar3,
                              ((cpi->common).seq_params)->bit_depth,
                              (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],iVar10,iVar4,
                              frame_type,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar5,
                              (cpi->oxcf).tune_cfg.tuning);
  if ((do_update != 0) || (x->qindex != iVar8)) {
    x->qindex = iVar8;
    x->seg_skip_block = 0;
    x->plane[0].quant_QTX = (cpi->enc_quant_dequant_params).quants.y_quant[iVar8];
    x->plane[0].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.y_quant_fp[iVar8];
    x->plane[0].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.y_round_fp[iVar8];
    x->plane[0].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.y_quant_shift[iVar8];
    x->plane[0].zbin_QTX = (cpi->enc_quant_dequant_params).quants.y_zbin[iVar8];
    x->plane[0].round_QTX = (cpi->enc_quant_dequant_params).quants.y_round[iVar8];
    x->plane[0].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.y_dequant_QTX[iVar8];
    x->plane[1].quant_QTX = (cpi->enc_quant_dequant_params).quants.u_quant[iVar8];
    x->plane[1].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.u_quant_fp[iVar8];
    x->plane[1].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.u_round_fp[iVar8];
    x->plane[1].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.u_quant_shift[iVar8];
    x->plane[1].zbin_QTX = (cpi->enc_quant_dequant_params).quants.u_zbin[iVar8];
    x->plane[1].round_QTX = (cpi->enc_quant_dequant_params).quants.u_round[iVar8];
    x->plane[1].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.u_dequant_QTX[iVar8];
    x->plane[2].quant_QTX = (cpi->enc_quant_dequant_params).quants.v_quant[iVar8];
    x->plane[2].quant_fp_QTX = (cpi->enc_quant_dequant_params).quants.v_quant_fp[iVar8];
    x->plane[2].round_fp_QTX = (cpi->enc_quant_dequant_params).quants.v_round_fp[iVar8];
    x->plane[2].quant_shift_QTX = (cpi->enc_quant_dequant_params).quants.v_quant_shift[iVar8];
    x->plane[2].zbin_QTX = (cpi->enc_quant_dequant_params).quants.v_zbin[iVar8];
    x->plane[2].round_QTX = (cpi->enc_quant_dequant_params).quants.v_round[iVar8];
    x->plane[2].dequant_QTX = (cpi->enc_quant_dequant_params).dequants.v_dequant_QTX[iVar8];
  }
  if ((x->prev_segment_id != segment_id) ||
     (_Var2 = av1_use_qmatrix(quant_params,&x->e_mbd,segment_id), _Var2)) {
    _Var2 = av1_use_qmatrix(quant_params,&x->e_mbd,segment_id);
    local_3c[1] = 0xf;
    local_3c[0] = 0xf;
    if (_Var2) {
      local_3c[0] = (cpi->common).quant_params.qmatrix_level_y;
      local_3c[1] = (cpi->common).quant_params.qmatrix_level_u;
    }
    local_3c[2] = 0xf;
    if (_Var2) {
      local_3c[2] = (cpi->common).quant_params.qmatrix_level_v;
    }
    paapqVar11 = (cpi->common).quant_params.gqmatrix;
    __dest = (x->e_mbd).plane[0].seg_iqmatrix + segment_id;
    lVar9 = 0;
    do {
      iVar10 = local_3c[lVar9];
      memcpy(__dest + 8,paapqVar11 + iVar10,0x98);
      memcpy(__dest,paapqVar11 + (long)iVar10 + -0x10,0x98);
      lVar9 = lVar9 + 1;
      paapqVar11 = (qm_val_t *(*) [3] [19])(*paapqVar11 + 1);
      __dest = (qm_val_t *(*) [19])((long)(__dest + 0x11) + 0x18);
    } while (lVar9 != 3);
  }
  if (seg->enabled == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = (cpi->common).seg.feature_mask[segment_id & 0xff] >> 6 & 1;
  }
  x->seg_skip_block = uVar5;
  iVar10 = 1;
  if (1 < iVar4 >> 6) {
    iVar10 = iVar4 >> 6;
  }
  x->errorperbit = iVar10;
  av1_set_sad_per_bit(cpi,&x->sadperbit,iVar3);
  x->prev_segment_id = segment_id;
  return;
}

Assistant:

void av1_init_plane_quantizers(const AV1_COMP *cpi, MACROBLOCK *x,
                               int segment_id, const int do_update) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonQuantParams *const quant_params = &cm->quant_params;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  int qindex_rd;

  const int current_qindex = AOMMAX(
      0,
      AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                   ? quant_params->base_qindex + x->delta_qindex
                                   : quant_params->base_qindex));
  const int qindex = av1_get_qindex(&cm->seg, segment_id, current_qindex);

  if (cpi->oxcf.sb_qp_sweep) {
    const int current_rd_qindex =
        AOMMAX(0, AOMMIN(QINDEX_RANGE - 1, cm->delta_q_info.delta_q_present_flag
                                               ? quant_params->base_qindex +
                                                     x->rdmult_delta_qindex
                                               : quant_params->base_qindex));
    qindex_rd = av1_get_qindex(&cm->seg, segment_id, current_rd_qindex);
  } else {
    qindex_rd = qindex;
  }

  const int qindex_rdmult = qindex_rd + quant_params->y_dc_delta_q;
  const int rdmult = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  const int qindex_change = x->qindex != qindex;
  if (qindex_change || do_update) {
    set_q_index(&cpi->enc_quant_dequant_params, qindex, x);
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  if ((segment_id != x->prev_segment_id) ||
      av1_use_qmatrix(quant_params, xd, segment_id)) {
    set_qmatrix(quant_params, segment_id, xd);
  }

  x->seg_skip_block = segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP);

  av1_set_error_per_bit(&x->errorperbit, rdmult);
  av1_set_sad_per_bit(cpi, &x->sadperbit, qindex_rd);

  x->prev_segment_id = segment_id;
}